

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O1

void slang::ast::Lookup::unqualifiedImpl
               (Scope *scope,string_view name,LookupLocation location,
               optional<slang::SourceRange> sourceRange,bitmask<slang::ast::LookupFlags> flags,
               SymbolIndex outOfBlockIndex,LookupResult *result,Scope *originalScope,
               SyntaxNode *originalSyntax)

{
  slot_type *psVar1;
  group_type_pointer pgVar2;
  SymbolMap *arrays_;
  size_t *psVar3;
  bitmask<slang::ast::MethodFlags> bVar4;
  undefined4 uVar5;
  SymbolKind SVar6;
  WildcardImportSymbol *pWVar7;
  int *piVar8;
  SourceManager *this;
  pointer pIVar9;
  group_type_pointer pgVar10;
  value_type_pointer ppVar11;
  char *pcVar12;
  undefined1 *puVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  optional<slang::SourceRange> sourceRange_00;
  string_view lookupName;
  string_view arg;
  string_view name_00;
  string_view arg_00;
  size_t sVar16;
  optional<bool> oVar17;
  int iVar18;
  uint64_t uVar19;
  SourceLocation SVar20;
  Type *pTVar21;
  Symbol *pSVar22;
  SubroutineSymbol *pSVar23;
  DeclaredType *pDVar24;
  PackageSymbol *this_00;
  ulong pos0;
  pointer pIVar25;
  Diagnostic *pDVar26;
  uint uVar27;
  uint uVar28;
  WildcardImportSymbol *pWVar29;
  pointer pIVar30;
  pointer pIVar31;
  SymbolIndex SVar32;
  WildcardImportData *pWVar33;
  WildcardImportData *pWVar34;
  slot_type *psVar35;
  ulong hash;
  ulong uVar36;
  pointer pIVar37;
  long lVar38;
  value_type_pointer ppVar39;
  SubroutineSymbol *sub;
  MethodPrototypeSymbol *this_01;
  Scope *pSVar40;
  long lVar41;
  ushort uVar42;
  SymbolIndex outOfBlockIndex_00;
  size_t sVar43;
  bool bVar44;
  bool bVar45;
  char cVar46;
  char cVar50;
  char cVar51;
  char cVar52;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  uchar uVar53;
  uchar uVar56;
  uchar uVar57;
  uchar uVar58;
  uchar uVar59;
  uchar uVar60;
  uchar uVar61;
  uchar uVar62;
  uchar uVar63;
  uchar uVar64;
  uchar uVar65;
  uchar uVar66;
  uchar uVar67;
  uchar uVar68;
  uchar uVar69;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  uchar uVar70;
  LookupLocation location_00;
  pair<const_slang::ast::ClassType_*,_bool> pVar71;
  try_emplace_args_t local_1a9;
  slot_type *local_1a8;
  pointer local_1a0;
  Scope *local_198;
  pointer local_190;
  ulong local_188;
  WildcardImportData *local_180;
  undefined8 local_178;
  uchar uStack_170;
  uchar uStack_16f;
  uchar uStack_16e;
  uchar uStack_16d;
  uchar uStack_16c;
  uchar uStack_16b;
  uchar uStack_16a;
  uchar uStack_169;
  Symbol *imported;
  value_type *elements;
  uchar uStack_150;
  uchar uStack_14f;
  uchar uStack_14e;
  uchar uStack_14d;
  uchar uStack_14c;
  uchar uStack_14b;
  uchar uStack_14a;
  uchar uStack_149;
  string_view name_local;
  anon_class_32_4_2e62d3a1 reportRecursiveError;
  locator res;
  SmallVector<Import,_4UL> imports;
  SmallSet<const_slang::ast::Symbol_*,_2UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>_>
  importDedup;
  
  name_local._M_str = name._M_str;
  name_local._M_len = name._M_len;
  local_188 = CONCAT44(local_188._4_4_,flags.m_bits);
  uVar27 = location.index;
  reportRecursiveError.sourceRange = &sourceRange;
  reportRecursiveError.name = &name_local;
  reportRecursiveError.result = result;
  reportRecursiveError.scope = scope;
  if (scope->deferredMemberIndex != Invalid) {
    Scope::elaborate(scope);
  }
  pIVar30 = (pointer)scope->nameMap;
  uVar19 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)pIVar30,
                      &name_local);
  sVar16 = name_local._M_len;
  pWVar33 = (WildcardImportData *)(uVar19 >> (*(byte *)&pIVar30->imported & 0x3f));
  pIVar37 = (pointer)pIVar30[1].imported;
  uVar5 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar19 & 0xff];
  auVar54._4_4_ = uVar5;
  auVar54._0_4_ = uVar5;
  auVar54._8_4_ = uVar5;
  auVar54._12_4_ = uVar5;
  local_178 = (Symbol *)name_local._M_str;
  psVar35 = (slot_type *)(ulong)((uint)uVar19 & 7);
  pWVar29 = (WildcardImportSymbol *)0x0;
  local_198 = scope;
  do {
    pIVar31 = pIVar37 + (long)pWVar33;
    auVar47[0] = -(*(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                    &pIVar31->imported == auVar54[0]);
    auVar47[1] = -(*(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                    ((long)&pIVar31->imported + 1) == auVar54[1]);
    auVar47[2] = -(*(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                    ((long)&pIVar31->imported + 2) == auVar54[2]);
    auVar47[3] = -(*(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                    ((long)&pIVar31->imported + 3) == auVar54[3]);
    auVar47[4] = -(*(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                    ((long)&pIVar31->imported + 4) == auVar54[4]);
    auVar47[5] = -(*(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                    ((long)&pIVar31->imported + 5) == auVar54[5]);
    auVar47[6] = -(*(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                    ((long)&pIVar31->imported + 6) == auVar54[6]);
    auVar47[7] = -(*(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                    ((long)&pIVar31->imported + 7) == auVar54[7]);
    auVar47[8] = -(*(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                    &pIVar31->import == auVar54[8]);
    auVar47[9] = -(*(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                    ((long)&pIVar31->import + 1) == auVar54[9]);
    auVar47[10] = -(*(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                     ((long)&pIVar31->import + 2) == auVar54[10]);
    auVar47[0xb] = -(*(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      ((long)&pIVar31->import + 3) == auVar54[0xb]);
    auVar47[0xc] = -(*(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      ((long)&pIVar31->import + 4) == auVar54[0xc]);
    auVar47[0xd] = -(*(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      ((long)&pIVar31->import + 5) == auVar54[0xd]);
    auVar47[0xe] = -(*(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      ((long)&pIVar31->import + 6) == auVar54[0xe]);
    auVar47[0xf] = -(*(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      ((long)&pIVar31->import + 7) == auVar54[0xf]);
    uVar28 = (uint)(ushort)((ushort)(SUB161(auVar47 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe);
    pWVar34 = pWVar33;
    if (uVar28 != 0) {
      pWVar7 = pIVar30[1].import;
      local_1a8 = psVar35;
      local_1a0 = pIVar30;
      local_190 = pIVar37;
      local_180 = pWVar33;
      _elements = auVar54;
      do {
        uVar14 = 0;
        if (uVar28 != 0) {
          for (; (uVar28 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
          }
        }
        bVar45 = sVar16 == *(size_t *)((long)pWVar7 + (ulong)uVar14 * 0x18 + (long)pWVar33 * 0x168);
        lVar38 = (long)pWVar7 + (ulong)uVar14 * 0x18 + (long)pWVar33 * 0x168;
        if (bVar45 && sVar16 != 0) {
          iVar18 = bcmp(local_178,*(void **)(lVar38 + 8),sVar16);
          bVar45 = iVar18 == 0;
          auVar54 = _elements;
        }
        scope = local_198;
        if (bVar45) goto LAB_0015809e;
        uVar28 = uVar28 - 1 & uVar28;
        psVar35 = local_1a8;
        pWVar34 = local_180;
        pIVar37 = local_190;
        pIVar30 = local_1a0;
      } while (uVar28 != 0);
    }
    if ((*(undefined1 *)((long)&pIVar37[(long)pWVar33].import + 7) &
        ((group_type_pointer)(psVar35 + 0x51f790))->m[0].n) == 0) break;
    pSVar22 = &pWVar29->super_Symbol;
    pWVar29 = (WildcardImportSymbol *)((long)&(pWVar29->super_Symbol).kind + 1);
    pWVar33 = (WildcardImportData *)
              ((ulong)((byte *)((long)&pSVar22->kind + 1) +
                      (long)&(pWVar34->wildcardImports).
                             super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
                      ) & (ulong)pIVar30->import);
  } while (pWVar29 <= pIVar30->import);
  lVar38 = 0;
LAB_0015809e:
  bVar45 = true;
  if (lVar38 == 0) {
    this_01 = (MethodPrototypeSymbol *)0x0;
  }
  else {
    this_01 = *(MethodPrototypeSymbol **)(lVar38 + 0x10);
    SVar6 = (this_01->super_Symbol).kind;
    bVar44 = *(uint *)((long)&this_01->super_Symbol + 0x30) < uVar27;
    uVar42 = (ushort)bVar44;
    if (bVar44) {
      if (((originalSyntax != (SyntaxNode *)0x0) && (SVar6 == TransparentMember)) &&
         (piVar8 = *(int **)&this_01->super_Scope, *piVar8 == 0xb)) {
        pTVar21 = *(Type **)(*(long *)(*(long *)(*(long *)(piVar8 + 8) + 8) + 0x20) + 8);
        if ((pTVar21->super_Symbol).kind == ClassType) {
          pVar71 = getContainingClass(scope);
          if (pVar71.first == (ClassType *)0x0) goto LAB_0015818c;
          bVar44 = Type::isDerivedFrom(&(pVar71.first)->super_Type,pTVar21);
        }
        else {
LAB_0015818c:
          bVar44 = false;
        }
        this = scope->compilation->sourceManager;
        if (this != (SourceManager *)0x0 && bVar44 == false) {
          imports.super_SmallVectorBase<Import>._0_16_ =
               slang::syntax::SyntaxNode::getFirstToken(originalSyntax);
          SVar20 = parsing::Token::location((Token *)&imports);
          oVar17 = SourceManager::isBeforeInCompilationUnit
                             (this,*(SourceLocation *)(piVar8 + 6),SVar20);
          uVar42 = (ushort)(oVar17.super__Optional_base<bool,_true,_true>._M_payload.
                            super__Optional_payload_base<bool>._M_payload & 1U |
                           ((ushort)oVar17.super__Optional_base<bool,_true,_true>._M_payload.
                                    super__Optional_payload_base<bool> >> 8 & 1) == 0);
        }
      }
    }
    else {
      if (SVar6 - Sequence < 2) {
        uVar42 = 1;
LAB_00158291:
        lVar38 = 0;
LAB_001582ad:
        bVar44 = true;
        if (lVar38 != 0) {
          uVar42 = (ushort)(*(uint *)(lVar38 + 0x30) < uVar27);
          (result->flags).m_bits = (result->flags).m_bits | 0x10;
        }
      }
      else {
        if (SVar6 == EnumValue) {
LAB_00158175:
          local_188 = local_188 & 0xffffffff00007ffd;
LAB_0015817d:
          lVar38 = 0;
          goto LAB_001582ad;
        }
        if (SVar6 == ClassType) {
          lVar38 = *(long *)((long)&this_01->declaredReturnType + 0x30);
          goto LAB_001582ad;
        }
        if ((SVar6 == Specparam) || (SVar6 == Parameter)) goto LAB_00158175;
        if (SVar6 != Subroutine) {
          if (SVar6 == GenericClassDef) {
            lVar38 = *(long *)((long)(this_01 + 2) + 0xd0);
            goto LAB_001582ad;
          }
          if (SVar6 == MethodPrototype) {
            uVar28 = *(uint *)((long)&this_01->declaredReturnType + 0x3c);
            if ((uVar28 >> 0x1e & 1) != 0) goto LAB_00158278;
            pTVar21 = DeclaredType::getType(&this_01->declaredReturnType);
            if (pTVar21->canonical == (Type *)0x0) {
              Type::resolveCanonical(pTVar21);
            }
            uVar42 = 1;
            if ((pTVar21->canonical->super_Symbol).kind != VoidType) {
              bVar4.m_bits = (underlying_type)*(SubroutineKind *)&this_01->flags;
              goto LAB_00158272;
            }
            goto LAB_00158288;
          }
          if (SVar6 == TypeAlias) {
            lVar38 = *(long *)((long)&this_01->declaredReturnType + 0x18);
            goto LAB_001582ad;
          }
          goto LAB_0015817d;
        }
        uVar28 = *(uint *)((long)&this_01->declaredReturnType + 0x3c);
        if ((uVar28 >> 0x1e & 1) == 0) {
          pTVar21 = DeclaredType::getType(&this_01->declaredReturnType);
          if (pTVar21->canonical == (Type *)0x0) {
            Type::resolveCanonical(pTVar21);
          }
          uVar42 = 1;
          if ((pTVar21->canonical->super_Symbol).kind != VoidType) {
            bVar4.m_bits = (underlying_type)*(SubroutineKind *)&this_01->field_0xc4;
LAB_00158272:
            uVar42 = bVar4.m_bits >> 9;
          }
        }
        else {
LAB_00158278:
          unqualifiedImpl::anon_class_32_4_2e62d3a1::operator()
                    (&reportRecursiveError,&this_01->super_Symbol);
        }
LAB_00158288:
        bVar44 = false;
        if ((uVar28 >> 0x1e & 1) == 0) goto LAB_00158291;
      }
      if (!bVar44) {
        bVar45 = false;
        goto LAB_00158442;
      }
    }
    if (((uVar42 & 1) != 0) || ((local_188 & 2) != 0)) {
      if ((this_01->super_Symbol).kind == TransparentMember) {
        do {
          this_01 = *(MethodPrototypeSymbol **)&this_01->super_Scope;
        } while ((this_01->super_Symbol).kind == TransparentMember);
        if (*(int *)*(long *)(*(long *)((long)&this_01->super_Symbol + 0x20) + 8) == 0x62) {
          for (pSVar22 = originalScope->thisSym; pSVar22->kind != AnonymousProgram;
              pSVar22 = pSVar22->parentScope->thisSym) {
            if (pSVar22->kind == InstanceBody) {
              if (*(int *)(pSVar22[2].name._M_str + 0x48) != 2) {
LAB_00158b2f:
                if (sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::SourceRange>._M_engaged == true) {
                  range_00.endLoc =
                       sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
                       super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
                  range_00.startLoc =
                       sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
                       super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc
                  ;
                  pDVar26 = Diagnostics::add(&result->diagnostics,scope->thisSym,(DiagCode)0xf000a,
                                             range_00);
                  Diagnostic::addNote(pDVar26,(DiagCode)0x50001,
                                      *(SourceLocation *)((long)&this_01->super_Symbol + 0x18));
                }
              }
              break;
            }
            if (pSVar22->parentScope == (Scope *)0x0) goto LAB_00158b2f;
          }
        }
      }
      SVar6 = (this_01->super_Symbol).kind;
      if (SVar6 != ForwardingTypedef) {
        if (SVar6 == ModportClocking) {
          pSVar23 = *(SubroutineSymbol **)&this_01->super_Scope;
        }
        else {
          if (SVar6 != MethodPrototype) {
            if (SVar6 == ExplicitImport) {
              pSVar22 = ExplicitImportSymbol::importedSymbol((ExplicitImportSymbol *)this_01);
              result->found = pSVar22;
              (result->flags).m_bits = (result->flags).m_bits | 1;
              Compilation::noteReference(scope->compilation,&this_01->super_Symbol,false);
            }
            else {
              result->found = &this_01->super_Symbol;
            }
            goto LAB_00158394;
          }
          pSVar23 = MethodPrototypeSymbol::getSubroutine(this_01);
        }
        result->found = &pSVar23->super_Symbol;
      }
LAB_00158394:
      if (((result->found != (Symbol *)0x0) &&
          (pDVar24 = Symbol::getDeclaredType(result->found), pDVar24 != (DeclaredType *)0x0)) &&
         ((pDVar24->field_0x3f & 0x40) != 0)) {
        if ((uVar42 & 1) == 0) {
          LookupResult::clear(result);
          goto LAB_00158442;
        }
        if (((reportRecursiveError.sourceRange)->
            super__Optional_base<slang::SourceRange,_true,_true>)._M_payload.
            super__Optional_payload_base<slang::SourceRange>._M_engaged == true) {
          pSVar22 = result->found;
          pDVar26 = Diagnostics::add(&(reportRecursiveError.result)->diagnostics,
                                     (reportRecursiveError.scope)->thisSym,(DiagCode)0x29000a,
                                     ((reportRecursiveError.sourceRange)->
                                     super__Optional_base<slang::SourceRange,_true,_true>).
                                     _M_payload.super__Optional_payload_base<slang::SourceRange>.
                                     _M_payload._M_value);
          Diagnostic::operator<<(pDVar26,*reportRecursiveError.name);
          Diagnostic::addNote(pDVar26,(DiagCode)0x50001,pSVar22->location);
        }
        (reportRecursiveError.result)->found = (Symbol *)0x0;
      }
      bVar45 = false;
    }
  }
LAB_00158442:
  if (!bVar45) {
    return;
  }
  pWVar33 = scope->importData;
  if (pWVar33 == (WildcardImportData *)0x0) {
LAB_001589f7:
    pSVar22 = local_198->thisSym;
    pSVar40 = pSVar22->parentScope;
    if (pSVar40 != (Scope *)0x0) {
      SVar32 = pSVar22->indexInScope + 1;
      SVar6 = pSVar22->kind;
      if (SVar6 == ConstraintBlock) {
        outOfBlockIndex_00 = *(SymbolIndex *)&pSVar22[2].name._M_str;
      }
      else if (SVar6 == Subroutine) {
        outOfBlockIndex_00 = (SymbolIndex)pSVar22[3].name._M_len;
      }
      else {
        if (outOfBlockIndex != 0) {
          SVar32 = outOfBlockIndex;
        }
        outOfBlockIndex_00 = 0;
      }
      if (SVar6 == ClassType) {
        if (pSVar22[1].indexInScope != 0) {
          Scope::elaborate((Scope *)&pSVar22[1].name);
        }
        SVar20 = pSVar22[2].location;
        if (SVar20 != (SourceLocation)0x0) {
          if (*(Type **)((long)SVar20 + 0x40) == (Type *)0x0) {
            Type::resolveCanonical((Type *)SVar20);
          }
          if (((*(Type **)((long)SVar20 + 0x40))->super_Symbol).kind == ErrorType) {
            (result->flags).m_bits = (result->flags).m_bits | 4;
          }
        }
      }
      if (((local_188._0_4_ >> 0xe & 1) == 0) || (pSVar40->thisSym->kind != CompilationUnit)) {
        name_00._M_str = name_local._M_str;
        name_00._M_len = name_local._M_len;
        sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._17_7_ =
             sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::SourceRange>._17_7_;
        sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._M_engaged =
             sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::SourceRange>._M_engaged;
        sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
             sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
        sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
             sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
        location_00.index = SVar32;
        location_00.scope = (Scope *)&sourceRange;
        location_00._12_4_ = 0;
        unqualifiedImpl(pSVar40,name_00,location_00,sourceRange_00,local_188._0_4_,
                        outOfBlockIndex_00,result,originalScope,originalSyntax);
      }
    }
    return;
  }
  local_180 = pWVar33;
  if ((local_188 & 4) != 0) {
    if (pWVar33->hasForceElaborated == false) {
      pWVar33->hasForceElaborated = true;
      Compilation::forceElaborate(local_198->compilation,local_198->thisSym);
    }
    uVar19 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                        &pWVar33->importedSymbols,&name_local);
    sVar16 = name_local._M_len;
    pIVar37 = (pointer)(uVar19 >>
                       ((byte)(pWVar33->importedSymbols).table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                              .arrays.groups_size_index & 0x3f));
    psVar35 = ((pWVar33->importedSymbols).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
               .arrays.groups_)->m;
    lVar38 = (uVar19 & 0xff) * 4;
    uVar53 = (&UNK_0051f39c)[lVar38];
    uVar56 = (&UNK_0051f39d)[lVar38];
    uVar57 = (&UNK_0051f39e)[lVar38];
    uVar58 = (&UNK_0051f39f)[lVar38];
    local_178 = (Symbol *)name_local._M_str;
    pIVar30 = (pointer)0x0;
    uVar59 = uVar53;
    uVar60 = uVar56;
    uVar61 = uVar57;
    uVar62 = uVar58;
    uVar63 = uVar53;
    uVar64 = uVar56;
    uVar65 = uVar57;
    uVar66 = uVar58;
    uVar67 = uVar53;
    uVar68 = uVar56;
    uVar69 = uVar57;
    uVar70 = uVar58;
    do {
      psVar1 = psVar35 + (long)pIVar37 * 0x10;
      auVar48[0] = -(psVar1->n == uVar53);
      auVar48[1] = -(psVar1[1].n == uVar56);
      auVar48[2] = -(psVar1[2].n == uVar57);
      auVar48[3] = -(psVar1[3].n == uVar58);
      auVar48[4] = -(psVar1[4].n == uVar59);
      auVar48[5] = -(psVar1[5].n == uVar60);
      auVar48[6] = -(psVar1[6].n == uVar61);
      auVar48[7] = -(psVar1[7].n == uVar62);
      auVar48[8] = -(psVar1[8].n == uVar63);
      auVar48[9] = -(psVar1[9].n == uVar64);
      auVar48[10] = -(psVar1[10].n == uVar65);
      auVar48[0xb] = -(psVar1[0xb].n == uVar66);
      auVar48[0xc] = -(psVar1[0xc].n == uVar67);
      auVar48[0xd] = -(psVar1[0xd].n == uVar68);
      auVar48[0xe] = -(psVar1[0xe].n == uVar69);
      auVar48[0xf] = -(psVar1[0xf].n == uVar70);
      uVar27 = (uint)(ushort)((ushort)(SUB161(auVar48 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar48 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar48 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar48 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar48 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar48 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar48 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar48 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar48 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar48 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar48 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar48 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar48 >> 0x77,0) & 1) << 0xe);
      pIVar31 = pIVar30;
      pIVar25 = pIVar37;
      if (uVar27 != 0) {
        ppVar11 = (local_180->importedSymbols).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                  .arrays.elements_;
        elements = (value_type *)
                   CONCAT17(uVar62,CONCAT16(uVar61,CONCAT15(uVar60,CONCAT14(uVar59,CONCAT13(uVar58,
                                                  CONCAT12(uVar57,CONCAT11(uVar56,uVar53)))))));
        uStack_150 = uVar63;
        uStack_14f = uVar64;
        uStack_14e = uVar65;
        uStack_14d = uVar66;
        uStack_14c = uVar67;
        uStack_14b = uVar68;
        uStack_14a = uVar69;
        uStack_149 = uVar70;
        local_1a8 = psVar35;
        local_1a0 = pIVar37;
        local_190 = pIVar30;
        do {
          uVar28 = 0;
          if (uVar27 != 0) {
            for (; (uVar27 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
            }
          }
          bVar45 = sVar16 == ppVar11[(long)pIVar37 * 0xf + (ulong)uVar28].first._M_len;
          ppVar39 = ppVar11 + (long)pIVar37 * 0xf + (ulong)uVar28;
          if (bVar45 && sVar16 != 0) {
            iVar18 = bcmp(local_178,(ppVar39->first)._M_str,sVar16);
            bVar45 = iVar18 == 0;
            uVar53 = (uchar)elements;
            uVar56 = elements._1_1_;
            uVar57 = elements._2_1_;
            uVar58 = elements._3_1_;
            uVar59 = elements._4_1_;
            uVar60 = elements._5_1_;
            uVar61 = elements._6_1_;
            uVar62 = elements._7_1_;
            uVar63 = uStack_150;
            uVar64 = uStack_14f;
            uVar65 = uStack_14e;
            uVar66 = uStack_14d;
            uVar67 = uStack_14c;
            uVar68 = uStack_14b;
            uVar69 = uStack_14a;
            uVar70 = uStack_149;
          }
          if (bVar45) goto LAB_00158cd5;
          uVar27 = uVar27 - 1 & uVar27;
          pIVar31 = local_190;
          pIVar25 = local_1a0;
          psVar35 = local_1a8;
        } while (uVar27 != 0);
      }
      if ((psVar35[(long)pIVar37 * 0x10 + 0xf].n &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[(uint)uVar19 & 7]) == 0) break;
      pIVar9 = (pointer)(local_180->importedSymbols).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                        .arrays.groups_size_mask;
      pIVar30 = (pointer)((long)&pIVar31->imported + 1);
      pIVar37 = (pointer)((ulong)((long)&pIVar31->imported + (long)((long)&pIVar25->imported + 1)) &
                         (ulong)pIVar9);
    } while (pIVar30 <= pIVar9);
    ppVar39 = (value_type_pointer)0x0;
LAB_00158cd5:
    if (ppVar39 != (value_type_pointer)0x0) {
      (result->flags).m_bits = (result->flags).m_bits | 1;
      result->found = ppVar39->second;
      return;
    }
    goto LAB_001589f7;
  }
  imports.super_SmallVectorBase<Import>.len = 0;
  imports.super_SmallVectorBase<Import>.data_ =
       (pointer)imports.super_SmallVectorBase<Import>.firstElement;
  importDedup.super_Storage.ptr = (char *)&importDedup;
  importDedup._32_8_ = 0x3f;
  importDedup._40_8_ = 1;
  importDedup._48_16_ = ZEXT816(0x51f2f0);
  importDedup._64_8_ = 0;
  importDedup._72_8_ = 0;
  imports.super_SmallVectorBase<Import>.cap = 4;
  pIVar30 = (pointer)(pWVar33->wildcardImports).
                     super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  pIVar37 = (pointer)(pWVar33->wildcardImports).
                     super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
  pIVar31 = pIVar37;
  importDedup.super_Storage._24_8_ = importDedup.super_Storage.ptr;
  if (pIVar30 != pIVar37) {
    do {
      local_1a0 = pIVar31;
      pWVar29 = (WildcardImportSymbol *)pIVar30->imported;
      if (uVar27 < (pWVar29->super_Symbol).indexInScope + 1) {
        iVar18 = 8;
      }
      else {
        this_00 = WildcardImportSymbol::getPackage(pWVar29);
        if (this_00 == (PackageSymbol *)0x0) {
          (result->flags).m_bits = (result->flags).m_bits | 4;
          iVar18 = 9;
        }
        else {
          lookupName._M_str = name_local._M_str;
          lookupName._M_len = name_local._M_len;
          imported = PackageSymbol::findForImport(this_00,lookupName);
          if (imported != (Symbol *)0x0) {
            auVar15._8_8_ = 0;
            auVar15._0_8_ = imported;
            hash = SUB168(auVar15 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                   SUB168(auVar15 * ZEXT816(0x9e3779b97f4a7c15),0);
            pos0 = hash >> (importDedup._32_1_ & 0x3f);
            uVar5 = (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      match_word(unsigned_long)::word)[hash & 0xff];
            elements = (value_type *)importDedup._56_8_;
            local_1a8 = (slot_type *)importDedup._40_8_;
            pIVar37 = (pointer)0x0;
            uVar36 = pos0;
            do {
              local_178 = (Symbol *)pIVar37;
              pcVar12 = (char *)(importDedup._48_8_ + uVar36 * 0x10);
              cVar46 = (char)uVar5;
              auVar55[0] = -(*pcVar12 == cVar46);
              cVar50 = (char)((uint)uVar5 >> 8);
              auVar55[1] = -(pcVar12[1] == cVar50);
              cVar51 = (char)((uint)uVar5 >> 0x10);
              auVar55[2] = -(pcVar12[2] == cVar51);
              cVar52 = (char)((uint)uVar5 >> 0x18);
              auVar55[3] = -(pcVar12[3] == cVar52);
              auVar55[4] = -(pcVar12[4] == cVar46);
              auVar55[5] = -(pcVar12[5] == cVar50);
              auVar55[6] = -(pcVar12[6] == cVar51);
              auVar55[7] = -(pcVar12[7] == cVar52);
              auVar55[8] = -(pcVar12[8] == cVar46);
              auVar55[9] = -(pcVar12[9] == cVar50);
              auVar55[10] = -(pcVar12[10] == cVar51);
              auVar55[0xb] = -(pcVar12[0xb] == cVar52);
              auVar55[0xc] = -(pcVar12[0xc] == cVar46);
              auVar55[0xd] = -(pcVar12[0xd] == cVar50);
              auVar55[0xe] = -(pcVar12[0xe] == cVar51);
              auVar55[0xf] = -(pcVar12[0xf] == cVar52);
              uVar28 = (uint)(ushort)((ushort)(SUB161(auVar55 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar55 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar55 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar55 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar55 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar55 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar55 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar55 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar55 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar55 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar55 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar55 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar55 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar55 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar55 >> 0x77,0) & 1) << 0xe);
              if (uVar28 != 0) {
                lVar38 = uVar36 * 0x78 + importDedup._56_8_;
                do {
                  uVar14 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                    }
                  }
                  if (imported == *(Symbol **)(lVar38 + (ulong)uVar14 * 8)) {
                    lVar38 = lVar38 + (ulong)uVar14 * 8;
                    goto LAB_0015865e;
                  }
                  uVar28 = uVar28 - 1 & uVar28;
                } while (uVar28 != 0);
              }
              if ((*(byte *)(uVar36 * 0x10 + importDedup._48_8_ + 0xf) &
                  (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) {
                lVar38 = 0;
                goto LAB_0015865e;
              }
              pIVar37 = (pointer)((long)&((pointer)local_178)->imported + 1);
              uVar36 = (ulong)((long)&((pointer)local_178)->imported + uVar36 + 1) &
                       importDedup._40_8_;
            } while (pIVar37 <= (ulong)importDedup._40_8_);
            lVar38 = 0;
LAB_0015865e:
            pIVar37 = local_1a0;
            if (lVar38 == 0) {
              if ((ulong)importDedup._72_8_ < (ulong)importDedup._64_8_) {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,16ul,16ul>>
                ::nosize_unchecked_emplace_at<slang::ast::Symbol_const*&>
                          (&res,(table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,16ul,16ul>>
                                 *)&importDedup.super_Storage.field_0x18,
                           (arrays_type *)&importDedup.field_0x20,pos0,hash,&imported);
                importDedup._72_8_ = importDedup._72_8_ + 1;
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,16ul,16ul>>
                ::unchecked_emplace_with_rehash<slang::ast::Symbol_const*&>
                          (&res,(table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::Symbol_const*,16ul,16ul>>
                                 *)&importDedup.super_Storage.field_0x18,hash,&imported);
              }
              pIVar31 = imports.super_SmallVectorBase<Import>.data_ +
                        imports.super_SmallVectorBase<Import>.len;
              if (imports.super_SmallVectorBase<Import>.len ==
                  imports.super_SmallVectorBase<Import>.cap) {
                local_178 = imported;
                elements = &pIVar31->imported;
                local_1a8 = (slot_type *)(imports.super_SmallVectorBase<Import>.len * 0x10);
                if (imports.super_SmallVectorBase<Import>.len == 0x7ffffffffffffff) {
                  slang::detail::throwLengthError();
                }
                uVar36 = imports.super_SmallVectorBase<Import>.len + 1;
                if (imports.super_SmallVectorBase<Import>.len + 1 <
                    imports.super_SmallVectorBase<Import>.cap * 2) {
                  uVar36 = imports.super_SmallVectorBase<Import>.cap * 2;
                }
                if (0x7ffffffffffffff - imports.super_SmallVectorBase<Import>.cap <
                    imports.super_SmallVectorBase<Import>.cap) {
                  uVar36 = 0x7ffffffffffffff;
                }
                pIVar25 = (pointer)operator_new(uVar36 << 4);
                *(Symbol **)(local_1a8 + (long)&pIVar25->imported) = local_178;
                *(WildcardImportSymbol **)((long)&pIVar25->import + (long)local_1a8) = pWVar29;
                pIVar31 = imports.super_SmallVectorBase<Import>.data_;
                sVar43 = (long)imports.super_SmallVectorBase<Import>.data_ +
                         (imports.super_SmallVectorBase<Import>.len * 0x10 - (long)elements);
                local_178 = (Symbol *)pIVar25;
                if (sVar43 == 0) {
                  if (imports.super_SmallVectorBase<Import>.len != 0) {
                    memmove(pIVar25,imports.super_SmallVectorBase<Import>.data_,
                            imports.super_SmallVectorBase<Import>.len * 0x10);
                  }
                }
                else {
                  local_190 = imports.super_SmallVectorBase<Import>.data_;
                  if (imports.super_SmallVectorBase<Import>.data_ != (pointer)elements) {
                    memmove(pIVar25,imports.super_SmallVectorBase<Import>.data_,
                            (long)elements - (long)imports.super_SmallVectorBase<Import>.data_);
                  }
                  memcpy(local_1a8 + (long)((long)local_178 + 0x10),elements,sVar43);
                  pIVar31 = local_190;
                }
                if (pIVar31 != (pointer)imports.super_SmallVectorBase<Import>.firstElement) {
                  operator_delete(pIVar31);
                }
                imports.super_SmallVectorBase<Import>.len =
                     imports.super_SmallVectorBase<Import>.len + 1;
                imports.super_SmallVectorBase<Import>.data_ = (pointer)local_178;
                imports.super_SmallVectorBase<Import>.cap = uVar36;
              }
              else {
                pIVar31->imported = imported;
                pIVar31->import = pWVar29;
                imports.super_SmallVectorBase<Import>.len =
                     imports.super_SmallVectorBase<Import>.len + 1;
              }
            }
          }
          iVar18 = 0;
        }
      }
    } while (((iVar18 == 9) || (iVar18 == 0)) &&
            (pIVar30 = (pointer)&pIVar30->import, pIVar31 = local_1a0, pIVar30 != pIVar37));
  }
  pWVar33 = local_180;
  pSVar40 = local_198;
  if (imports.super_SmallVectorBase<Import>.len == 0) {
    res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)
             importDedup.super_Storage._24_8_;
    if (importDedup._56_8_ != 0) {
      slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>::deallocate
                ((StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL> *)&res,
                 (Symbol **)importDedup._56_8_,importDedup._40_8_ * 0x88 + 0x96U >> 3);
    }
    if (imports.super_SmallVectorBase<Import>.data_ !=
        (pointer)imports.super_SmallVectorBase<Import>.firstElement) {
      operator_delete(imports.super_SmallVectorBase<Import>.data_);
    }
    goto LAB_001589f7;
  }
  if (imports.super_SmallVectorBase<Import>.len != 1) {
    if (sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._M_engaged == true) {
      range.endLoc = sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
                     super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
      range.startLoc =
           sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
      pDVar26 = Diagnostics::add(&result->diagnostics,local_198->thisSym,(DiagCode)0xa,range);
      arg._M_str = name_local._M_str;
      arg._M_len = name_local._M_len;
      Diagnostic::operator<<(pDVar26,arg);
      if (imports.super_SmallVectorBase<Import>.len != 0) {
        pIVar30 = imports.super_SmallVectorBase<Import>.data_;
        lVar41 = imports.super_SmallVectorBase<Import>.len << 4;
        lVar38 = 0;
        do {
          Diagnostic::addNote(pDVar26,(DiagCode)0x3f000a,
                              *(SourceLocation *)(*(long *)((long)&pIVar30->import + lVar38) + 0x18)
                             );
          Diagnostic::addNote(pDVar26,(DiagCode)0x50001,
                              *(SourceLocation *)
                               (*(long *)((long)&pIVar30->imported + lVar38) + 0x18));
          lVar38 = lVar38 + 0x10;
        } while (lVar41 != lVar38);
      }
    }
    goto LAB_00158938;
  }
  if ((this_01 != (MethodPrototypeSymbol *)0x0) &&
     (sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged == true)) {
    if ((this_01->super_Symbol).kind == ExplicitImport) {
      pSVar22 = ExplicitImportSymbol::importedSymbol((ExplicitImportSymbol *)this_01);
      if (pSVar22 == (imports.super_SmallVectorBase<Import>.data_)->imported) goto LAB_00158dc5;
    }
    range_01.endLoc =
         sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
         super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
    range_01.startLoc =
         sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
         super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
    pDVar26 = Diagnostics::add(&result->diagnostics,pSVar40->thisSym,(DiagCode)0x10000a,range_01);
    arg_00._M_str = name_local._M_str;
    arg_00._M_len = name_local._M_len;
    Diagnostic::operator<<(pDVar26,arg_00);
    Diagnostic::addNote(pDVar26,(DiagCode)0x50001,
                        *(SourceLocation *)((long)&this_01->super_Symbol + 0x18));
    Diagnostic::addNote(pDVar26,(DiagCode)0x3f000a,
                        ((imports.super_SmallVectorBase<Import>.data_)->import->super_Symbol).
                        location);
    Diagnostic::addNote(pDVar26,(DiagCode)0x50001,
                        (imports.super_SmallVectorBase<Import>.data_)->imported->location);
  }
LAB_00158dc5:
  (result->flags).m_bits = (result->flags).m_bits | 1;
  result->found = (imports.super_SmallVectorBase<Import>.data_)->imported;
  Compilation::noteReference
            (pSVar40->compilation,
             &(imports.super_SmallVectorBase<Import>.data_)->import->super_Symbol,false);
  arrays_ = &pWVar33->importedSymbols;
  pSVar22 = result->found;
  pSVar40 = (Scope *)&pSVar22->name;
  uVar19 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)arrays_,
                      (basic_string_view<char,_std::char_traits<char>_> *)pSVar40);
  pIVar37 = (pointer)(uVar19 >>
                     ((byte)(pWVar33->importedSymbols).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                            .arrays.groups_size_index & 0x3f));
  pgVar10 = (pWVar33->importedSymbols).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
            .arrays.groups_;
  lVar38 = (uVar19 & 0xff) * 4;
  uVar53 = (&UNK_0051f39c)[lVar38];
  uVar56 = (&UNK_0051f39d)[lVar38];
  uVar57 = (&UNK_0051f39e)[lVar38];
  uVar58 = (&UNK_0051f39f)[lVar38];
  uVar27 = (uint)uVar19;
  local_1a8 = (slot_type *)0x0;
  pIVar30 = pIVar37;
  uVar59 = uVar53;
  uVar60 = uVar56;
  uVar61 = uVar57;
  uVar62 = uVar58;
  uVar63 = uVar53;
  uVar64 = uVar56;
  uVar65 = uVar57;
  uVar66 = uVar58;
  uVar67 = uVar53;
  uVar68 = uVar56;
  uVar69 = uVar57;
  uVar70 = uVar58;
  do {
    elements = (value_type *)((long)pIVar37 * 0x10);
    pgVar2 = pgVar10 + (long)pIVar37;
    auVar49[0] = -(pgVar2->m[0].n == uVar53);
    auVar49[1] = -(pgVar2->m[1].n == uVar56);
    auVar49[2] = -(pgVar2->m[2].n == uVar57);
    auVar49[3] = -(pgVar2->m[3].n == uVar58);
    auVar49[4] = -(pgVar2->m[4].n == uVar59);
    auVar49[5] = -(pgVar2->m[5].n == uVar60);
    auVar49[6] = -(pgVar2->m[6].n == uVar61);
    auVar49[7] = -(pgVar2->m[7].n == uVar62);
    auVar49[8] = -(pgVar2->m[8].n == uVar63);
    auVar49[9] = -(pgVar2->m[9].n == uVar64);
    auVar49[10] = -(pgVar2->m[10].n == uVar65);
    auVar49[0xb] = -(pgVar2->m[0xb].n == uVar66);
    auVar49[0xc] = -(pgVar2->m[0xc].n == uVar67);
    auVar49[0xd] = -(pgVar2->m[0xd].n == uVar68);
    auVar49[0xe] = -(pgVar2->m[0xe].n == uVar69);
    auVar49[0xf] = -(pgVar2->m[0xf].n == uVar70);
    uVar28 = (uint)(ushort)((ushort)(SUB161(auVar49 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe);
    local_190 = pIVar37;
    if (uVar28 != 0) {
      ppVar11 = (pWVar33->importedSymbols).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                .arrays.elements_;
      sVar43 = (pSVar22->name)._M_len;
      pcVar12 = (pSVar22->name)._M_str;
      local_178 = (Symbol *)
                  CONCAT17(uVar62,CONCAT16(uVar61,CONCAT15(uVar60,CONCAT14(uVar59,CONCAT13(uVar58,
                                                  CONCAT12(uVar57,CONCAT11(uVar56,uVar53)))))));
      local_1a0 = pIVar30;
      local_198 = pSVar40;
      local_188 = uVar19;
      uStack_170 = uVar63;
      uStack_16f = uVar64;
      uStack_16e = uVar65;
      uStack_16d = uVar66;
      uStack_16c = uVar67;
      uStack_16b = uVar68;
      uStack_16a = uVar69;
      uStack_169 = uVar70;
      do {
        uVar14 = 0;
        if (uVar28 != 0) {
          for (; (uVar28 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
          }
        }
        bVar45 = sVar43 == ppVar11[(long)pIVar37 * 0xf + (ulong)uVar14].first._M_len;
        ppVar39 = ppVar11 + (long)pIVar37 * 0xf + (ulong)uVar14;
        if (bVar45 && sVar43 != 0) {
          iVar18 = bcmp(pcVar12,(ppVar39->first)._M_str,sVar43);
          bVar45 = iVar18 == 0;
          uVar53 = (uchar)local_178;
          uVar56 = local_178._1_1_;
          uVar57 = local_178._2_1_;
          uVar58 = local_178._3_1_;
          uVar59 = local_178._4_1_;
          uVar60 = local_178._5_1_;
          uVar61 = local_178._6_1_;
          uVar62 = local_178._7_1_;
          uVar63 = uStack_170;
          uVar64 = uStack_16f;
          uVar65 = uStack_16e;
          uVar66 = uStack_16d;
          uVar67 = uStack_16c;
          uVar68 = uStack_16b;
          uVar69 = uStack_16a;
          uVar70 = uStack_169;
        }
        uVar19 = local_188;
        pIVar30 = local_1a0;
        pWVar33 = local_180;
        pSVar40 = local_198;
        if (bVar45) goto LAB_00158fc3;
        uVar28 = uVar28 - 1 & uVar28;
      } while (uVar28 != 0);
    }
    if ((*(byte *)((long)elements + (long)pgVar10 + 0xf) &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[uVar27 & 7]) == 0) break;
    puVar13 = (undefined1 *)
              (pWVar33->importedSymbols).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
              .arrays.groups_size_mask;
    psVar35 = local_1a8 + (long)((long)&local_190->imported + 1);
    local_1a8 = local_1a8 + 1;
    pIVar37 = (pointer)((ulong)psVar35 & (ulong)puVar13);
  } while (local_1a8 <= puVar13);
  ppVar39 = (value_type_pointer)0x0;
LAB_00158fc3:
  if (ppVar39 == (value_type_pointer)0x0) {
    if ((pWVar33->importedSymbols).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
        .size_ctrl.size <
        (pWVar33->importedSymbols).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::Symbol_const*&>
                ((locator *)&res,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                  *)arrays_,(arrays_type *)arrays_,(size_t)pIVar30,uVar19,&local_1a9,
                 (basic_string_view<char,_std::char_traits<char>_> *)pSVar40,&result->found);
      psVar3 = &(pWVar33->importedSymbols).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                .size_ctrl.size;
      *psVar3 = *psVar3 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::Symbol_const*&>
                ((locator *)&res,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                  *)arrays_,uVar19,&local_1a9,
                 (basic_string_view<char,_std::char_traits<char>_> *)pSVar40,&result->found);
    }
  }
LAB_00158938:
  res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)
           importDedup.super_Storage._24_8_;
  if (importDedup._56_8_ != 0) {
    slang::detail::hashing::StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL>::deallocate
              ((StackAllocator<const_slang::ast::Symbol_*,_16UL,_16UL> *)&res,
               (Symbol **)importDedup._56_8_,importDedup._40_8_ * 0x88 + 0x96U >> 3);
  }
  if (imports.super_SmallVectorBase<Import>.data_ ==
      (pointer)imports.super_SmallVectorBase<Import>.firstElement) {
    return;
  }
  operator_delete(imports.super_SmallVectorBase<Import>.data_);
  return;
}

Assistant:

void Lookup::unqualifiedImpl(const Scope& scope, std::string_view name, LookupLocation location,
                             std::optional<SourceRange> sourceRange, bitmask<LookupFlags> flags,
                             SymbolIndex outOfBlockIndex, LookupResult& result,
                             const Scope& originalScope, const SyntaxNode* originalSyntax) {
    auto reportRecursiveError = [&](const Symbol& symbol) {
        if (sourceRange) {
            auto& diag = result.addDiag(scope, diag::RecursiveDefinition, *sourceRange);
            diag << name;
            diag.addNote(diag::NoteDeclarationHere, symbol.location);
        }
        result.found = nullptr;
    };

    // Try a simple name lookup to see if we find anything.
    auto& nameMap = scope.getNameMap();
    const Symbol* symbol = nullptr;
    if (auto it = nameMap.find(name); it != nameMap.end()) {
        // If the lookup is for a local name, check that we can access the symbol (it must be
        // declared before use). Callables and block names can be referenced anywhere in the
        // scope, so the location doesn't matter for them.
        symbol = it->second;
        bool locationGood = LookupLocation::before(*symbol) < location;
        if (!locationGood) {
            // A type alias can have forward definitions, so check those locations as well.
            // The forward decls form a linked list that are always ordered by location,
            // so we only need to check the first one.
            const ForwardingTypedefSymbol* forward = nullptr;
            switch (symbol->kind) {
                case SymbolKind::TypeAlias:
                    forward = symbol->as<TypeAliasType>().getFirstForwardDecl();
                    break;
                case SymbolKind::ClassType:
                    forward = symbol->as<ClassType>().getFirstForwardDecl();
                    break;
                case SymbolKind::GenericClassDef:
                    forward = symbol->as<GenericClassDefSymbol>().getFirstForwardDecl();
                    break;
                case SymbolKind::Subroutine: {
                    // Subroutines can be referenced before they are declared if they
                    // are tasks or return void (tasks are always set to have a void
                    // return type internally so we only need one check here).
                    //
                    // It's important to check that we're not in the middle of evaluating
                    // the return type before we try to access that return type or
                    // we'll hard fail.
                    auto& sub = symbol->as<SubroutineSymbol>();
                    if (sub.declaredReturnType.isEvaluating()) {
                        reportRecursiveError(*symbol);
                        return;
                    }

                    // Also allow built-ins to always be found; they don't really
                    // have a location since they're intrinsically defined.
                    locationGood = sub.getReturnType().isVoid() ||
                                   sub.flags.has(MethodFlags::BuiltIn);
                    break;
                }
                case SymbolKind::MethodPrototype: {
                    // Same as above.
                    auto& sub = symbol->as<MethodPrototypeSymbol>();
                    if (sub.declaredReturnType.isEvaluating()) {
                        reportRecursiveError(*symbol);
                        return;
                    }

                    locationGood = sub.getReturnType().isVoid() ||
                                   sub.flags.has(MethodFlags::BuiltIn);
                    break;
                }
                case SymbolKind::Sequence:
                case SymbolKind::Property:
                    // Sequences and properties can always be referenced before declaration.
                    locationGood = true;
                    break;
                case SymbolKind::Parameter:
                case SymbolKind::Specparam:
                case SymbolKind::EnumValue:
                    // Constants can never be looked up before their declaration,
                    // to avoid problems with recursive constant evaluation.
                    flags &= ~LookupFlags::AllowDeclaredAfter;
                    break;
                default:
                    break;
            }

            if (forward) {
                locationGood = LookupLocation::before(*forward) < location;
                result.flags |= LookupResultFlags::FromForwardTypedef;
            }
        }
        else if (symbol->kind == SymbolKind::TransparentMember && originalSyntax) {
            // Enum values are special in that we can't always get a precise ordering
            // of where they are declared in a scope, since they can be declared inside
            // a nested subexpression. Check for correct location by looking at the
            // actual source locations involved.
            auto& wrapped = symbol->as<TransparentMemberSymbol>().wrapped;
            if (wrapped.kind == SymbolKind::EnumValue) {
                // If the enum was inherited from a base class then we shouldn't
                // worry about the source location; the base class may be declared
                // later in the file.
                bool skipLocationCheck = false;
                auto enumScope = wrapped.getParentScope()->asSymbol().getParentScope();
                SLANG_ASSERT(enumScope);
                if (enumScope->asSymbol().kind == SymbolKind::ClassType) {
                    auto containingClass = getContainingClass(scope).first;
                    if (containingClass &&
                        containingClass->isDerivedFrom(enumScope->asSymbol().as<ClassType>())) {
                        skipLocationCheck = true;
                    }
                }

                if (auto sm = scope.getCompilation().getSourceManager(); sm && !skipLocationCheck) {
                    auto loc = originalSyntax->getFirstToken().location();
                    locationGood =
                        sm->isBeforeInCompilationUnit(wrapped.location, loc).value_or(true);
                }
            }
        }

        if (locationGood || flags.has(LookupFlags::AllowDeclaredAfter)) {
            // Unwrap the symbol if it's hidden behind an import or hoisted enum member.
            if (symbol->kind == SymbolKind::TransparentMember) {
                do {
                    symbol = &symbol->as<TransparentMemberSymbol>().wrapped;
                } while (symbol->kind == SymbolKind::TransparentMember);

                // Special case check for a lookup finding hoisted members of an anonymous
                // program. For these we need to verify that the original lookup location is
                // also in a program.
                if (symbol->getParentScope()->asSymbol().kind == SymbolKind::AnonymousProgram &&
                    !isInProgram(originalScope.asSymbol()) && sourceRange) {
                    auto& diag = result.addDiag(scope, diag::IllegalReferenceToProgramItem,
                                                *sourceRange);
                    diag.addNote(diag::NoteDeclarationHere, symbol->location);
                }
            }

            switch (symbol->kind) {
                case SymbolKind::ExplicitImport:
                    result.found = symbol->as<ExplicitImportSymbol>().importedSymbol();
                    result.flags |= LookupResultFlags::WasImported;
                    scope.getCompilation().noteReference(*symbol);
                    break;
                case SymbolKind::ForwardingTypedef:
                    // If we find a forwarding typedef, the actual typedef was never defined.
                    // Just ignore it, we'll issue a better error later.
                    break;
                case SymbolKind::MethodPrototype:
                    // Looking up a prototype should always forward on to the actual method.
                    result.found = symbol->as<MethodPrototypeSymbol>().getSubroutine();
                    break;
                case SymbolKind::ModportClocking:
                    result.found = symbol->as<ModportClockingSymbol>().target;
                    break;
                default:
                    result.found = symbol;
                    break;
            }

            // We have a fully resolved and valid symbol. Before we return back to the caller,
            // make sure that the symbol we're returning isn't in the process of having its type
            // evaluated. This can only happen with a mutually recursive definition of something
            // like a parameter and a function, so detect and report the error here to avoid a
            // stack overflow.
            bool done = true;
            if (result.found) {
                auto declaredType = result.found->getDeclaredType();
                if (declaredType && declaredType->isEvaluating()) {
                    if (locationGood) {
                        reportRecursiveError(*result.found);
                    }
                    else {
                        // We overrode the location checking via a flag and
                        // it's probably biting us now by causing us to find
                        // our own symbol when we otherwise shouldn't.
                        // Work around this by just pretending we didn't find anything.
                        done = false;
                        result.clear();
                    }
                }
            }

            if (done)
                return;
        }
    }

    // Look through any wildcard imports prior to the lookup point and see if their packages
    // contain the name we're looking for.
    if (auto wildcardImportData = scope.getWildcardImportData()) {
        if (flags.has(LookupFlags::DisallowWildcardImport)) {
            // We're in a context that disallows new imports via wildcard imports,
            // but we can still reference any symbols that were previously imported
            // that way from some other lookup. In order to be sure we've seen all of
            // those lookups we need to force elaborate the scope first.
            if (!wildcardImportData->hasForceElaborated) {
                wildcardImportData->hasForceElaborated = true;
                scope.getCompilation().forceElaborate(scope.asSymbol());
            }

            if (auto it = wildcardImportData->importedSymbols.find(name);
                it != wildcardImportData->importedSymbols.end()) {
                result.flags |= LookupResultFlags::WasImported;
                result.found = it->second;
                return;
            }
        }
        else {
            struct Import {
                const Symbol* imported;
                const WildcardImportSymbol* import;
            };
            SmallVector<Import, 4> imports;
            SmallSet<const Symbol*, 2> importDedup;

            for (auto import : wildcardImportData->wildcardImports) {
                if (location < LookupLocation::after(*import))
                    break;

                auto package = import->getPackage();
                if (!package) {
                    result.flags |= LookupResultFlags::SuppressUndeclared;
                    continue;
                }

                const Symbol* imported = package->findForImport(name);
                if (imported && importDedup.emplace(imported).second)
                    imports.emplace_back(Import{imported, import});
            }

            if (!imports.empty()) {
                if (imports.size() > 1) {
                    if (sourceRange) {
                        auto& diag = result.addDiag(scope, diag::AmbiguousWildcardImport,
                                                    *sourceRange);
                        diag << name;
                        for (const auto& pair : imports) {
                            diag.addNote(diag::NoteImportedFrom, pair.import->location);
                            diag.addNote(diag::NoteDeclarationHere, pair.imported->location);
                        }
                    }
                    return;
                }

                if (symbol && sourceRange) {
                    // The existing symbol might be an import for the thing we just imported
                    // via wildcard, which is fine so don't error for that case.
                    if (symbol->kind != SymbolKind::ExplicitImport ||
                        symbol->as<ExplicitImportSymbol>().importedSymbol() !=
                            imports[0].imported) {

                        auto& diag = result.addDiag(scope, diag::ImportNameCollision, *sourceRange);
                        diag << name;
                        diag.addNote(diag::NoteDeclarationHere, symbol->location);
                        diag.addNote(diag::NoteImportedFrom, imports[0].import->location);
                        diag.addNote(diag::NoteDeclarationHere, imports[0].imported->location);
                    }
                }

                result.flags |= LookupResultFlags::WasImported;
                result.found = imports[0].imported;
                scope.getCompilation().noteReference(*imports[0].import);

                wildcardImportData->importedSymbols.try_emplace(result.found->name, result.found);
                return;
            }
        }
    }

    // Continue up the scope chain via our parent.
    location = LookupLocation::after(scope.asSymbol());
    if (!location.getScope())
        return;

    // If this scope was an out-of-block subroutine, tell the next recursive call about it.
    // Otherwise, if our previous call was for such a situation and we didn't find the symbol
    // in this class scope, we need to use the subroutine's out-of-block lookup location
    // instead in order to properly handle cases like:
    //   class C;
    //     extern function int foo;
    //   endclass
    //   localparam int k = ...;
    //   function int C::foo;
    //     return k;
    //   endfunction
    auto& sym = scope.asSymbol();
    if (sym.kind == SymbolKind::Subroutine) {
        outOfBlockIndex = sym.as<SubroutineSymbol>().outOfBlockIndex;
    }
    else if (sym.kind == SymbolKind::ConstraintBlock) {
        outOfBlockIndex = sym.as<ConstraintBlockSymbol>().getOutOfBlockIndex();
    }
    else if (uint32_t(outOfBlockIndex) != 0) {
        location = LookupLocation(location.getScope(), uint32_t(outOfBlockIndex));
        outOfBlockIndex = SymbolIndex(0);
    }

    if (sym.kind == SymbolKind::ClassType) {
        // Suppress errors when we fail to find a symbol inside a class that
        // had a problem resolving its base class, since the symbol may be
        // expected to be defined in the base.
        auto baseClass = sym.as<ClassType>().getBaseClass();
        if (baseClass && baseClass->isError())
            result.flags |= LookupResultFlags::SuppressUndeclared;
    }

    if (flags.has(LookupFlags::DisallowUnitReferences) &&
        location.getScope()->asSymbol().kind == SymbolKind::CompilationUnit) {
        return;
    }

    return unqualifiedImpl(*location.getScope(), name, location, sourceRange, flags,
                           outOfBlockIndex, result, originalScope, originalSyntax);
}